

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall solitaire::graphics::Renderer::renderButtons(Renderer *this)

{
  pointer pGVar1;
  undefined4 local_38;
  undefined4 local_34;
  Size local_30;
  TextureId local_28;
  undefined4 local_24;
  undefined4 local_20;
  Size local_1c;
  TextureId local_14;
  Renderer *local_10;
  Renderer *this_local;
  
  local_10 = this;
  setButtonsAlpha(this);
  pGVar1 = std::
           unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ::operator->(&this->graphicsSystem);
  TextureId::TextureId(&local_14,&this->newGameId);
  local_24 = 0;
  local_20 = 0;
  local_1c.width = 0x3a;
  local_1c.height = 0x11;
  (*pGVar1->_vptr_GraphicsSystem[5])(pGVar1,&local_14,&Layout::newGameButtonPosition,&local_24);
  pGVar1 = std::
           unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ::operator->(&this->graphicsSystem);
  TextureId::TextureId(&local_28,&this->undoId);
  local_38 = 0;
  local_34 = 0;
  local_30.width = 0x22;
  local_30.height = 0x11;
  (*pGVar1->_vptr_GraphicsSystem[5])(pGVar1,&local_28,&Layout::undoButtonPosition,&local_38);
  return;
}

Assistant:

void Renderer::renderButtons() const {
    setButtonsAlpha();

    graphicsSystem->renderTexture(
        newGameId, Layout::newGameButtonPosition,
        Area {Position {0, 0}, Layout::newGameButtonSize});

    graphicsSystem->renderTexture(
        undoId, Layout::undoButtonPosition,
        Area {Position {0, 0}, Layout::undoButtonSize});
}